

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_x_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint16_t *puVar4;
  int16_t *piVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  byte bVar10;
  uint uVar11;
  uint16_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int local_84;
  
  bVar8 = (byte)conv_params->round_0;
  cVar9 = (char)conv_params->round_1;
  cVar7 = bVar8 + cVar9;
  cVar6 = (char)bd - cVar7;
  if (0 < h) {
    puVar4 = conv_params->dst;
    uVar1 = filter_params_x->taps;
    iVar18 = (1 << (cVar6 + 0xdU & 0x1f)) + (1 << (cVar6 + 0xeU & 0x1f));
    bVar10 = 0xe - cVar7;
    piVar5 = filter_params_x->filter_ptr;
    iVar2 = conv_params->dst_stride;
    local_84 = 1 - (uint)(uVar1 >> 1);
    uVar14 = 0;
    do {
      if (0 < w) {
        iVar3 = conv_params->do_average;
        uVar13 = 0;
        iVar19 = local_84;
        do {
          if ((ulong)filter_params_x->taps == 0) {
            iVar15 = 0;
          }
          else {
            uVar17 = 0;
            iVar15 = 0;
            do {
              iVar15 = iVar15 + (uint)src[(long)iVar19 + uVar17] *
                                (int)*(short *)((long)piVar5 +
                                               uVar17 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar1 * 2));
              uVar17 = uVar17 + 1;
            } while (filter_params_x->taps != uVar17);
          }
          iVar15 = ((iVar15 + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f)) << (7U - cVar9 & 0x1f)
                   ) + iVar18;
          puVar12 = puVar4;
          iVar16 = iVar2;
          if (iVar3 != 0) {
            uVar11 = (uint)puVar4[uVar14 * (long)iVar2 + uVar13];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar15 = (int)(iVar15 + uVar11) >> 1;
            }
            else {
              iVar15 = (int)(iVar15 * conv_params->bck_offset + uVar11 * conv_params->fwd_offset) >>
                       4;
            }
            iVar15 = iVar15 + (((1 << (bVar10 & 0x1f)) >> 1) - iVar18) >> (bVar10 & 0x1f);
            if (bd == 10) {
              iVar16 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar16 = 0xfff;
            }
            else {
              iVar16 = 0xff;
            }
            if (iVar16 <= iVar15) {
              iVar15 = iVar16;
            }
            puVar12 = dst;
            iVar16 = dst_stride;
            if (iVar15 < 1) {
              iVar15 = 0;
            }
          }
          puVar12[uVar13 + (long)iVar16 * uVar14] = (uint16_t)iVar15;
          uVar13 = uVar13 + 1;
          iVar19 = iVar19 + 1;
        } while (uVar13 != (uint)w);
      }
      uVar14 = uVar14 + 1;
      local_84 = local_84 + src_stride;
    } while (uVar14 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_x,
                                      const int subpel_x_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = (1 << bits) * ROUND_POWER_OF_TWO(res, conv_params->round_0);
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}